

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall
capnp::compiler::Compiler::Node::traverseAnnotations
          (Node *this,Reader *annotations,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  ElementCount EVar1;
  Maybe<capnp::compiler::Compiler::Node_&> this_00;
  ElementCount index;
  uint64_t id;
  Reader annotation;
  StructReader local_60;
  
  EVar1 = (annotations->reader).elementCount;
  if (EVar1 != 0) {
    index = 0;
    do {
      capnp::_::ListReader::getStructElement(&local_60,&annotations->reader,index);
      if (local_60.dataSize < 0x40) {
        id = 0;
      }
      else {
        id = *local_60.data;
      }
      this_00 = Compiler::Impl::findNode(this->module->compiler,id);
      if (this_00.ptr != (Node *)0x0) {
        traverse(this_00.ptr,eagerness,seen,finalLoader,sourceInfo);
      }
      index = index + 1;
    } while (EVar1 != index);
  }
  return;
}

Assistant:

void Compiler::Node::traverseAnnotations(const List<schema::Annotation>::Reader& annotations,
                                         uint eagerness,
                                         std::unordered_map<Node*, uint>& seen,
                                         const SchemaLoader& finalLoader,
                                         kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  for (auto annotation: annotations) {
    KJ_IF_MAYBE(node, module->getCompiler().findNode(annotation.getId())) {
      node->traverse(eagerness, seen, finalLoader, sourceInfo);
    }
  }
}